

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::TriangleRasterizer::rasterizeSingleSample
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float *pfVar1;
  Vec4 *pVVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int i;
  long lVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  Vec4 e20f;
  Vec4 e12f;
  Vec4 e01f;
  deInt64 sy [4];
  long local_128 [12];
  float local_c8 [8];
  undefined8 local_a8;
  undefined8 uStack_a0;
  long local_78 [4];
  uint uStack_58;
  int iStack_54;
  Vector<long,_4> e20;
  Vector<long,_4> e12;
  
  iVar26 = (this->m_bboxMax).m_data[1];
  iVar4 = (this->m_curPos).m_data[1];
  iVar25 = 0;
  if (0 < maxFragmentPackets && iVar4 <= iVar26) {
    fVar3 = (this->m_v2).m_data[2];
    fVar30 = (this->m_v1).m_data[2] - fVar3;
    fVar29 = (this->m_v0).m_data[2] - fVar3;
    iVar25 = 0;
    do {
      iVar5 = (this->m_curPos).m_data[0];
      local_78[0] = (long)(int)(iVar4 << 8 | 0x80);
      local_78[2] = (long)(int)((iVar4 + 1) * 0x100 | 0x80);
      iVar24 = iVar5 + 1;
      e20.m_data[1]._0_4_ = iVar5 << 8 | 0x80;
      e20.m_data[2]._0_4_ = iVar24 * 0x100 | 0x80;
      e20.m_data[1]._4_4_ = -(uint)((int)(uint)e20.m_data[1] < 0);
      e20.m_data[2]._4_4_ = -(uint)((int)(uint)e20.m_data[2] < 0);
      uStack_58 = (uint)e20.m_data[1];
      iStack_54 = -(uint)((int)(uint)e20.m_data[1] < 0);
      e20.m_data[0]._0_4_ = (uint)e20.m_data[2];
      e20.m_data[0]._4_4_ = -(uint)((int)(uint)e20.m_data[2] < 0);
      local_78[1] = local_78[0];
      local_78[3] = local_78[2];
      iVar19 = (this->m_viewport).m_data[3];
      iVar18 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
      iVar6 = (this->m_viewport).m_data[1];
      local_128[10] = 0;
      local_128[0xb] = 0;
      local_128[8] = 0;
      local_128[9] = 0;
      local_128[6] = 0;
      local_128[7] = 0;
      local_128[4] = 0;
      local_128[5] = 0;
      local_128[2] = 0;
      local_128[3] = 0;
      local_128[0] = 0;
      local_128[1] = 0;
      lVar27 = (this->m_edge01).a;
      lVar21 = (this->m_edge01).b;
      lVar7 = (this->m_edge01).c;
      lVar8 = (this->m_edge12).a;
      lVar9 = (this->m_edge12).b;
      lVar10 = (this->m_edge12).c;
      lVar11 = (this->m_edge20).a;
      lVar12 = (this->m_edge20).b;
      lVar13 = (this->m_edge20).c;
      lVar28 = 0;
      do {
        lVar14 = e20.m_data[lVar28 + -1];
        lVar15 = local_78[lVar28];
        local_128[lVar28 + 8] = lVar21 * lVar15 + lVar27 * lVar14 + lVar7;
        local_128[lVar28 + 4] = lVar9 * lVar15 + lVar8 * lVar14 + lVar10;
        local_128[lVar28] = lVar15 * lVar12 + lVar14 * lVar11 + lVar13;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 4);
      uVar23 = (ulong)(this->m_edge01).inclusive;
      lVar27 = -uVar23;
      if (local_128[8] == lVar27 ||
          SBORROW8(local_128[8],lVar27) != (long)(local_128[8] + uVar23) < 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = (ulong)(this->m_edge12).inclusive;
        lVar21 = -uVar20;
        if (local_128[4] == lVar21 ||
            SBORROW8(local_128[4],lVar21) != (long)(local_128[4] + uVar20) < 0) {
          uVar20 = 0;
        }
        else {
          uVar20 = (ulong)(this->m_edge20).inclusive;
          lVar21 = -uVar20;
          uVar20 = (ulong)(local_128[0] != lVar21 &&
                          SBORROW8(local_128[0],lVar21) == (long)(local_128[0] + uVar20) < 0);
        }
      }
      if ((((iVar24 != iVar18) &&
           (local_128[9] != lVar27 &&
            SBORROW8(local_128[9],lVar27) == (long)(local_128[9] + uVar23) < 0)) &&
          (uVar22 = (ulong)(this->m_edge12).inclusive, lVar21 = -uVar22,
          local_128[5] != lVar21 &&
          SBORROW8(local_128[5],lVar21) == (long)(local_128[5] + uVar22) < 0)) &&
         (uVar22 = (ulong)(this->m_edge20).inclusive, lVar21 = -uVar22,
         local_128[1] != lVar21 &&
         SBORROW8(local_128[1],lVar21) == (long)(local_128[1] + uVar22) < 0)) {
        uVar20 = uVar20 + 4;
      }
      if (iVar4 + 1 != iVar19 + iVar6) {
        if (((local_128[10] != lVar27 &&
              SBORROW8(local_128[10],lVar27) == (long)(local_128[10] + uVar23) < 0) &&
            (uVar22 = (ulong)(this->m_edge12).inclusive, lVar21 = -uVar22,
            local_128[6] != lVar21 &&
            SBORROW8(local_128[6],lVar21) == (long)(local_128[6] + uVar22) < 0)) &&
           (uVar22 = (ulong)(this->m_edge20).inclusive, lVar21 = -uVar22,
           local_128[2] != lVar21 &&
           SBORROW8(local_128[2],lVar21) == (long)(local_128[2] + uVar22) < 0)) {
          uVar20 = uVar20 | 2;
        }
        if (((iVar24 != iVar18) &&
            (local_128[0xb] != lVar27 &&
             SBORROW8(local_128[0xb],lVar27) == (long)(local_128[0xb] + uVar23) < 0)) &&
           (uVar23 = (ulong)(this->m_edge12).inclusive, lVar27 = -uVar23,
           local_128[7] != lVar27 &&
           SBORROW8(local_128[7],lVar27) == (long)(local_128[7] + uVar23) < 0)) {
          uVar23 = (ulong)(this->m_edge20).inclusive;
          lVar27 = -uVar23;
          uVar20 = uVar20 + (ulong)(local_128[3] != lVar27 &&
                                   SBORROW8(local_128[3],lVar27) ==
                                   (long)(local_128[3] + uVar23) < 0) * 8;
        }
      }
      (this->m_curPos).m_data[0] = iVar5 + 2;
      iVar19 = iVar4;
      if ((this->m_bboxMax).m_data[0] < iVar5 + 2) {
        iVar19 = iVar4 + 2;
        (this->m_curPos).m_data[1] = iVar19;
        (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
      }
      if (uVar20 != 0) {
        local_a8 = 0;
        uStack_a0 = 0;
        lVar27 = 0;
        do {
          *(ulong *)((long)&local_a8 + lVar27 * 4) =
               CONCAT44((float)local_128[lVar27 + 9],(float)local_128[lVar27 + 8]);
          lVar27 = lVar27 + 2;
        } while (lVar27 != 4);
        local_c8[4] = 0.0;
        local_c8[5] = 0.0;
        local_c8[6] = 0.0;
        local_c8[7] = 0.0;
        lVar27 = 0;
        do {
          *(ulong *)(local_c8 + lVar27 + 4) =
               CONCAT44((float)local_128[lVar27 + 5],(float)local_128[lVar27 + 4]);
          lVar27 = lVar27 + 2;
        } while (lVar27 != 4);
        local_c8[0] = 0.0;
        local_c8[1] = 0.0;
        local_c8[2] = 0.0;
        local_c8[3] = 0.0;
        lVar27 = 0;
        do {
          *(ulong *)(local_c8 + lVar27) =
               CONCAT44((float)local_128[lVar27 + 1],(float)local_128[lVar27]);
          lVar27 = lVar27 + 2;
        } while (lVar27 != 4);
        if (depthValues != (float *)0x0) {
          auVar31._4_4_ = local_c8[5];
          auVar31._0_4_ = local_c8[4];
          auVar31._8_4_ = local_c8[6];
          auVar31._12_4_ = local_c8[7];
          auVar35._4_4_ = local_c8[1];
          auVar35._0_4_ = local_c8[0];
          auVar35._8_4_ = local_c8[2];
          auVar35._12_4_ = local_c8[3];
          auVar33._0_4_ = (float)local_a8 + local_c8[4] + local_c8[0];
          auVar33._4_4_ = local_a8._4_4_ + local_c8[5] + local_c8[1];
          auVar33._8_4_ = (float)uStack_a0 + local_c8[6] + local_c8[2];
          auVar33._12_4_ = uStack_a0._4_4_ + local_c8[7] + local_c8[3];
          auVar31 = divps(auVar31,auVar33);
          auVar35 = divps(auVar35,auVar33);
          pfVar1 = depthValues + iVar25 * 4;
          *pfVar1 = auVar35._0_4_ * fVar30 + auVar31._0_4_ * fVar29 + fVar3;
          pfVar1[1] = auVar35._4_4_ * fVar30 + auVar31._4_4_ * fVar29 + fVar3;
          pfVar1[2] = auVar35._8_4_ * fVar30 + auVar31._8_4_ * fVar29 + fVar3;
          pfVar1[3] = auVar35._12_4_ * fVar30 + auVar31._12_4_ * fVar29 + fVar3;
        }
        fVar39 = (this->m_v0).m_data[3];
        auVar32._0_4_ = fVar39 * local_c8[4];
        auVar32._4_4_ = fVar39 * local_c8[5];
        auVar32._8_4_ = fVar39 * local_c8[6];
        auVar32._12_4_ = fVar39 * local_c8[7];
        fVar39 = (this->m_v1).m_data[3];
        auVar34._0_4_ = fVar39 * local_c8[0];
        auVar34._4_4_ = fVar39 * local_c8[1];
        auVar34._8_4_ = fVar39 * local_c8[2];
        auVar34._12_4_ = fVar39 * local_c8[3];
        fVar39 = (this->m_v2).m_data[3];
        fVar36 = auVar32._0_4_ + auVar34._0_4_ + fVar39 * (float)local_a8;
        fVar37 = auVar32._4_4_ + auVar34._4_4_ + fVar39 * local_a8._4_4_;
        fVar38 = auVar32._8_4_ + auVar34._8_4_ + fVar39 * (float)uStack_a0;
        fVar39 = auVar32._12_4_ + auVar34._12_4_ + fVar39 * uStack_a0._4_4_;
        *(ulong *)fragmentPackets[iVar25].position.m_data = CONCAT44(iVar4,iVar5);
        fragmentPackets[iVar25].coverage = uVar20;
        auVar16._4_4_ = fVar37;
        auVar16._0_4_ = fVar36;
        auVar16._8_4_ = fVar38;
        auVar16._12_4_ = fVar39;
        auVar35 = divps(auVar32,auVar16);
        *(undefined1 (*) [16])fragmentPackets[iVar25].barycentric[0].m_data = auVar35;
        auVar17._4_4_ = fVar37;
        auVar17._0_4_ = fVar36;
        auVar17._8_4_ = fVar38;
        auVar17._12_4_ = fVar39;
        auVar31 = divps(auVar34,auVar17);
        *(undefined1 (*) [16])fragmentPackets[iVar25].barycentric[1].m_data = auVar31;
        pVVar2 = fragmentPackets[iVar25].barycentric + 2;
        pVVar2->m_data[0] = (1.0 - auVar35._0_4_) - auVar31._0_4_;
        pVVar2->m_data[1] = (1.0 - auVar35._4_4_) - auVar31._4_4_;
        pVVar2->m_data[2] = (1.0 - auVar35._8_4_) - auVar31._8_4_;
        pVVar2->m_data[3] = (1.0 - auVar35._12_4_) - auVar31._12_4_;
        iVar25 = iVar25 + 1;
        iVar26 = (this->m_bboxMax).m_data[1];
        iVar19 = (this->m_curPos).m_data[1];
      }
    } while ((iVar19 <= iVar26) && (iVar4 = iVar19, iVar25 < maxFragmentPackets));
  }
  *numPacketsRasterized = iVar25;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeSingleSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation; given barycentrics A, B, C = (1 - A - B)
	// we can reformulate the usual z = z0*A + z1*B + z2*C into more
	// stable equation z = A*(z0 - z2) + B*(z1 - z2) + z2.
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0)	+ halfPixel;
		const deInt64	sx1		= toSubpixelCoord(x0+1)	+ halfPixel;
		const deInt64	sy0		= toSubpixelCoord(y0)	+ halfPixel;
		const deInt64	sy1		= toSubpixelCoord(y0+1)	+ halfPixel;

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01;
		tcu::Vector<deInt64, 4>	e12;
		tcu::Vector<deInt64, 4>	e20;

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values
		for (int i = 0; i < 4; i++)
		{
			e01[i] = evaluateEdge(m_edge01, sx[i], sy[i]);
			e12[i] = evaluateEdge(m_edge12, sx[i], sy[i]);
			e20[i] = evaluateEdge(m_edge20, sx[i], sy[i]);
		}

		// Compute coverage mask
		coverage = setCoverageValue(coverage, 1, 0, 0, 0,						isInsideCCW(m_edge01, e01[0]) && isInsideCCW(m_edge12, e12[0]) && isInsideCCW(m_edge20, e20[0]));
		coverage = setCoverageValue(coverage, 1, 1, 0, 0, !outX1 &&				isInsideCCW(m_edge01, e01[1]) && isInsideCCW(m_edge12, e12[1]) && isInsideCCW(m_edge20, e20[1]));
		coverage = setCoverageValue(coverage, 1, 0, 1, 0, !outY1 &&				isInsideCCW(m_edge01, e01[2]) && isInsideCCW(m_edge12, e12[2]) && isInsideCCW(m_edge20, e20[2]));
		coverage = setCoverageValue(coverage, 1, 1, 1, 0, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[3]) && isInsideCCW(m_edge12, e12[3]) && isInsideCCW(m_edge20, e20[3]));

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Floating-point edge values for barycentrics etc.
		const tcu::Vec4		e01f	= e01.asFloat();
		const tcu::Vec4		e12f	= e12.asFloat();
		const tcu::Vec4		e20f	= e20.asFloat();

		// Compute depth values.
		if (depthValues)
		{
			const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
			const tcu::Vec4		z0		= e12f / edgeSum;
			const tcu::Vec4		z1		= e20f / edgeSum;

			depthValues[packetNdx*4+0] = z0[0]*za + z1[0]*zb + zc;
			depthValues[packetNdx*4+1] = z0[1]*za + z1[1]*zb + zc;
			depthValues[packetNdx*4+2] = z0[2]*za + z1[2]*zb + zc;
			depthValues[packetNdx*4+3] = z0[3]*za + z1[3]*zb + zc;
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}